

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringlist.cpp
# Opt level: O2

qsizetype lastIndexof_helper<QStringView>
                    (QStringList *that,QStringView needle,qsizetype from,CaseSensitivity cs)

{
  long lVar1;
  ulong uVar2;
  QString *pQVar3;
  int iVar4;
  qsizetype i;
  long lVar5;
  long lVar6;
  qsizetype qVar7;
  long in_FS_OFFSET;
  QStringView other;
  QStringView needle_local;
  
  needle_local.m_data = needle.m_data;
  needle_local.m_size = needle.m_size;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = (that->d).size;
  lVar5 = uVar2 - 1;
  if ((ulong)from < uVar2) {
    lVar5 = from;
  }
  if (from < 0) {
    lVar5 = uVar2 + from;
  }
  lVar6 = lVar5 * 0x18 + 0x10;
  while ((qVar7 = -1, -1 < lVar5 &&
         (pQVar3 = (that->d).ptr,
         other.m_data = *(storage_type_conflict **)((long)pQVar3 + lVar6 + -8),
         other.m_size = *(qsizetype *)((long)&(pQVar3->d).d + lVar6),
         iVar4 = QStringView::compare(&needle_local,other,cs), qVar7 = lVar5, iVar4 != 0))) {
    lVar5 = lVar5 + -1;
    lVar6 = lVar6 + -0x18;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return qVar7;
}

Assistant:

qsizetype lastIndexof_helper(const QStringList &that, String needle, qsizetype from,
                             Qt::CaseSensitivity cs)
{
    if (from < 0)
        from += that.size();
    else if (from >= that.size())
        from = that.size() - 1;

     for (qsizetype i = from; i >= 0; --i) {
        if (needle.compare(that.at(i), cs) == 0)
            return i;
    }

    return -1;
}